

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

cio_error cio_socket_set_tcp_no_delay(cio_socket *socket,_Bool on)

{
  int iVar1;
  int *piVar2;
  uint local_20;
  undefined1 local_19;
  int tcp_no_delay;
  _Bool on_local;
  cio_socket *socket_local;
  
  local_20 = (uint)on;
  local_19 = on;
  _tcp_no_delay = socket;
  iVar1 = setsockopt((socket->impl).ev.fd,6,1,&local_20,4);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    socket_local._4_4_ = -*piVar2;
  }
  else {
    socket_local._4_4_ = CIO_SUCCESS;
  }
  return socket_local._4_4_;
}

Assistant:

enum cio_error cio_socket_set_tcp_no_delay(struct cio_socket *socket, bool on)
{
	int tcp_no_delay = (int)on;

	if (setsockopt(socket->impl.ev.fd, IPPROTO_TCP, TCP_NODELAY, &tcp_no_delay,
	               sizeof(tcp_no_delay)) < 0) {
		return (enum cio_error)(-errno);
	}

	return CIO_SUCCESS;
}